

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O0

void __thiscall highwayhash::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  ThreadPool *this_local;
  
  StartWorkers(this,0xffffffffffffffff);
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  thread = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&thread);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  std::function<void_(int)>::~function(&this->task_);
  std::condition_variable::~condition_variable(&this->worker_start_cv_);
  std::condition_variable::~condition_variable(&this->workers_ready_cv_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    StartWorkers(kWorkerExit);

    for (std::thread& thread : threads_) {
      thread.join();
    }
  }